

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpcollisionlist.h
# Opt level: O2

void __thiscall jrtplib::RTPCollisionList::~RTPCollisionList(RTPCollisionList *this)

{
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPCollisionList_0014dfa0;
  Clear(this);
  std::__cxx11::
  _List_base<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
  ::_M_clear(&(this->addresslist).
              super__List_base<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
            );
  return;
}

Assistant:

~RTPCollisionList()								{ Clear(); }